

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O1

void aom_lpf_vertical_6_c(uint8_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  byte *op2;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  op2 = s + -3;
  iVar7 = 4;
  do {
    bVar1 = op2[1];
    bVar2 = op2[2];
    bVar3 = op2[3];
    bVar4 = op2[4];
    uVar9 = (uint)*op2 - (uint)bVar1;
    uVar5 = -uVar9;
    if (0 < (int)uVar9) {
      uVar5 = uVar9;
    }
    uVar10 = (uint)bVar1 - (uint)bVar2;
    uVar9 = -uVar10;
    if (0 < (int)uVar10) {
      uVar9 = uVar10;
    }
    uVar15 = (uint)bVar4 - (uint)bVar3;
    uVar10 = -uVar15;
    if (0 < (int)uVar15) {
      uVar10 = uVar15;
    }
    uVar13 = (uint)op2[5] - (uint)bVar4;
    uVar15 = -uVar13;
    if (0 < (int)uVar13) {
      uVar15 = uVar13;
    }
    uVar14 = (uint)bVar2 - (uint)bVar3;
    uVar13 = -uVar14;
    if (0 < (int)uVar14) {
      uVar13 = uVar14;
    }
    uVar11 = (uint)bVar1 - (uint)bVar4;
    uVar14 = -uVar11;
    if (0 < (int)uVar11) {
      uVar14 = uVar11;
    }
    bVar1 = *limit;
    iVar8 = (uint)*op2 - (uint)bVar2;
    iVar6 = -iVar8;
    if (0 < iVar8) {
      iVar6 = iVar8;
    }
    iVar12 = (uint)op2[5] - (uint)bVar3;
    iVar8 = -iVar12;
    if (0 < iVar12) {
      iVar8 = iVar12;
    }
    filter6(-(((uVar14 & 0xff) >> 1) + (uVar13 & 0xff) * 2 <= (uint)*blimit &&
             (((uVar15 & 0xff) <= (uint)bVar1 && (uVar10 & 0xff) <= (uint)bVar1) &&
             ((uVar9 & 0xff) <= (uint)bVar1 && (uVar5 & 0xff) <= (uint)bVar1))),*thresh,
            -((byte)((byte)uVar10 | (byte)uVar9 | (byte)iVar8 | (byte)iVar6) < 2),op2,op2 + 1,
            op2 + 2,op2 + 3,op2 + 4,op2 + 5);
    op2 = op2 + pitch;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  return;
}

Assistant:

void aom_lpf_vertical_6_c(uint8_t *s, int pitch, const uint8_t *blimit,
                          const uint8_t *limit, const uint8_t *thresh) {
  int i;
  int count = 4;

  for (i = 0; i < count; ++i) {
    const uint8_t p2 = s[-3], p1 = s[-2], p0 = s[-1];
    const uint8_t q0 = s[0], q1 = s[1], q2 = s[2];
    const int8_t mask =
        filter_mask3_chroma(*limit, *blimit, p2, p1, p0, q0, q1, q2);
    const int8_t flat = flat_mask3_chroma(1, p2, p1, p0, q0, q1, q2);
    filter6(mask, *thresh, flat, s - 3, s - 2, s - 1, s, s + 1, s + 2);
    s += pitch;
  }
}